

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lgc.c
# Opt level: O3

lu_mem singlestep(lua_State *L)

{
  global_State *g_00;
  global_State *pgVar1;
  GCObject *o;
  GCObject **ppGVar2;
  global_State *g;
  int i;
  int iVar3;
  GCObject **old;
  lu_mem lVar4;
  
  g_00 = L->l_G;
  g_00->gcstopem = '\x01';
  lVar4 = 0;
  switch(g_00->gcstate) {
  case '\0':
    if (g_00->gray == (GCObject *)0x0) {
      g_00->gcstate = '\x01';
      goto LAB_0010aacb;
    }
    lVar4 = propagatemark(g_00);
    break;
  case '\x01':
    lVar4 = atomic(L);
    pgVar1 = L->l_G;
    pgVar1->gcstate = '\x03';
    ppGVar2 = &pgVar1->allgc;
    do {
      ppGVar2 = sweeplist(L,ppGVar2,1,(int *)0x0);
    } while (ppGVar2 == &pgVar1->allgc);
    pgVar1->sweepgc = ppGVar2;
    g_00->GCestimate = g_00->GCdebt + g_00->totalbytes;
    break;
  default:
    goto switchD_0010a988_caseD_2;
  case '\x03':
    ppGVar2 = &g_00->finobj;
    iVar3 = 4;
    goto LAB_0010aabd;
  case '\x04':
    ppGVar2 = &g_00->tobefnz;
    iVar3 = 5;
    goto LAB_0010aabd;
  case '\x05':
    iVar3 = 6;
    ppGVar2 = (GCObject **)0x0;
LAB_0010aabd:
    iVar3 = sweepstep(L,g_00,iVar3,ppGVar2);
    lVar4 = (lu_mem)iVar3;
    break;
  case '\x06':
    checkSizes(L,g_00);
    g_00->gcstate = '\a';
LAB_0010aacb:
    lVar4 = 0;
    break;
  case '\a':
    if ((g_00->tobefnz == (GCObject *)0x0) || (g_00->gcemergency != '\0')) {
      g_00->gcstate = '\b';
      goto LAB_0010aacb;
    }
    g_00->gcstopem = '\0';
    iVar3 = 0;
    do {
      if (g_00->tobefnz == (GCObject *)0x0) goto LAB_0010ab08;
      GCTM(L);
      iVar3 = iVar3 + 1;
    } while (iVar3 != 10);
    iVar3 = 10;
LAB_0010ab08:
    lVar4 = (lu_mem)(uint)(iVar3 * 0x32);
    break;
  case '\b':
    g_00->weak = (GCObject *)0x0;
    g_00->ephemeron = (GCObject *)0x0;
    g_00->gray = (GCObject *)0x0;
    g_00->grayagain = (GCObject *)0x0;
    g_00->allweak = (GCObject *)0x0;
    if ((g_00->mainthread->marked & 0x18) != 0) {
      reallymarkobject(g_00,(GCObject *)g_00->mainthread);
    }
    if ((((g_00->l_registry).tt_ & 0x40) != 0) &&
       (o = (g_00->l_registry).value_.gc, (o->marked & 0x18) != 0)) {
      reallymarkobject(g_00,o);
    }
    markmt(g_00);
    markbeingfnz(g_00);
    g_00->gcstate = '\0';
    lVar4 = 1;
  }
  g_00->gcstopem = '\0';
switchD_0010a988_caseD_2:
  return lVar4;
}

Assistant:

static lu_mem singlestep (lua_State *L) {
  global_State *g = G(L);
  lu_mem work;
  lua_assert(!g->gcstopem);  /* collector is not reentrant */
  g->gcstopem = 1;  /* no emergency collections while collecting */
  switch (g->gcstate) {
    case GCSpause: {
      restartcollection(g);
      g->gcstate = GCSpropagate;
      work = 1;
      break;
    }
    case GCSpropagate: {
      if (g->gray == NULL) {  /* no more gray objects? */
        g->gcstate = GCSenteratomic;  /* finish propagate phase */
        work = 0;
      }
      else
        work = propagatemark(g);  /* traverse one gray object */
      break;
    }
    case GCSenteratomic: {
      work = atomic(L);  /* work is what was traversed by 'atomic' */
      entersweep(L);
      g->GCestimate = gettotalbytes(g);  /* first estimate */
      break;
    }
    case GCSswpallgc: {  /* sweep "regular" objects */
      work = sweepstep(L, g, GCSswpfinobj, &g->finobj);
      break;
    }
    case GCSswpfinobj: {  /* sweep objects with finalizers */
      work = sweepstep(L, g, GCSswptobefnz, &g->tobefnz);
      break;
    }
    case GCSswptobefnz: {  /* sweep objects to be finalized */
      work = sweepstep(L, g, GCSswpend, NULL);
      break;
    }
    case GCSswpend: {  /* finish sweeps */
      checkSizes(L, g);
      g->gcstate = GCScallfin;
      work = 0;
      break;
    }
    case GCScallfin: {  /* call remaining finalizers */
      if (g->tobefnz && !g->gcemergency) {
        g->gcstopem = 0;  /* ok collections during finalizers */
        work = runafewfinalizers(L, GCFINMAX) * GCFINALIZECOST;
      }
      else {  /* emergency mode or no more finalizers */
        g->gcstate = GCSpause;  /* finish collection */
        work = 0;
      }
      break;
    }
    default: lua_assert(0); return 0;
  }
  g->gcstopem = 0;
  return work;
}